

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_minimum_scalar_alignment
          (PhysicalStorageBufferPointerHandler *this,SPIRType *type)

{
  Compiler *this_00;
  uint32_t uVar1;
  TypedID<(spirv_cross::Types)1> *pTVar2;
  SPIRType *type_00;
  uint32_t member_align;
  TypedID<(spirv_cross::Types)1> *member_type;
  TypedID<(spirv_cross::Types)1> *__end3;
  TypedID<(spirv_cross::Types)1> *__begin3;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range3;
  uint32_t alignment;
  SPIRType *type_local;
  PhysicalStorageBufferPointerHandler *this_local;
  
  if (type->storage == StorageClassPhysicalStorageBuffer) {
    this_local._4_4_ = 8;
  }
  else if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    __range3._4_4_ = 0;
    __end3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                       (&(type->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
    pTVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                       (&(type->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
    for (; __end3 != pTVar2; __end3 = __end3 + 1) {
      this_00 = this->compiler;
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end3);
      type_00 = get<spirv_cross::SPIRType>(this_00,uVar1);
      uVar1 = get_minimum_scalar_alignment(this,type_00);
      if (__range3._4_4_ < uVar1) {
        __range3._4_4_ = uVar1;
      }
    }
    this_local._4_4_ = __range3._4_4_;
  }
  else {
    this_local._4_4_ = type->width >> 3;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Compiler::PhysicalStorageBufferPointerHandler::get_minimum_scalar_alignment(const SPIRType &type) const
{
	if (type.storage == spv::StorageClassPhysicalStorageBufferEXT)
		return 8;
	else if (type.basetype == SPIRType::Struct)
	{
		uint32_t alignment = 0;
		for (auto &member_type : type.member_types)
		{
			uint32_t member_align = get_minimum_scalar_alignment(compiler.get<SPIRType>(member_type));
			if (member_align > alignment)
				alignment = member_align;
		}
		return alignment;
	}
	else
		return type.width / 8;
}